

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

natwm_state * natwm_state_create(void)

{
  int iVar1;
  natwm_state *state;
  
  state = (natwm_state *)calloc(1,0x70);
  if (state == (natwm_state *)0x0) {
    state = (natwm_state *)0x0;
  }
  else {
    state->screen_num = -1;
    state->xcb = (xcb_connection_t *)0x0;
    state->ewmh = (xcb_ewmh_connection_t *)0x0;
    state->screen = (xcb_screen_t *)0x0;
    state->button_state = (button_state *)0x0;
    state->monitor_list = (monitor_list *)0x0;
    state->workspace_list = (workspace_list *)0x0;
    state->config = (map *)0x0;
    state->config_path = (char *)0x0;
    iVar1 = pthread_mutex_init((pthread_mutex_t *)&state->mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 != 0) {
      state = (natwm_state *)0x0;
    }
  }
  return state;
}

Assistant:

struct natwm_state *natwm_state_create(void)
{
        struct natwm_state *state = calloc(1, sizeof(struct natwm_state));

        if (state == NULL) {
                return NULL;
        }

        state->screen_num = -1;
        state->xcb = NULL;
        state->ewmh = NULL;
        state->screen = NULL;
        state->button_state = NULL;
        state->monitor_list = NULL;
        state->workspace_list = NULL;
        state->config = NULL;
        state->config_path = NULL;

        // Initialize mutex
        if (pthread_mutex_init(&state->mutex, NULL) != 0) {
                return NULL;
        }

        return state;
}